

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O3

void __thiscall
ki::protocol::dml::MessageTemplate::set_access_level(MessageTemplate *this,uint8_t access_level)

{
  Record *this_00;
  Field<unsigned_char> *pFVar1;
  string local_40;
  
  this_00 = this->m_record;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"_MsgAccessLvl","");
  pFVar1 = ki::dml::Record::add_field<unsigned_char>(this_00,&local_40,true);
  pFVar1->m_value = access_level;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MessageTemplate::set_access_level(uint8_t access_level)
	{
		m_record->add_field<ki::dml::UBYT>("_MsgAccessLvl")->set_value(access_level);
	}